

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
fmcalc::assign_coverage_ids
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,fmcalc *this,
          int level,int to_agg_id)

{
  bool bVar1;
  reference __x;
  reference pvVar2;
  reference pvVar3;
  reference piVar4;
  iterator __first;
  iterator __last;
  reference this_00;
  reference this_01;
  undefined1 local_90 [8];
  set<int,_std::less<int>,_std::allocator<int>_> temp_set;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  iterator agg_id;
  int to_agg_id_local;
  int level_local;
  fmcalc *this_local;
  set<int,_std::less<int>,_std::allocator<int>_> *ret_set;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  if (level == 0) {
    __x = std::vector<int,_std::allocator<int>_>::operator[](&this->item_to_cov_id_,(long)to_agg_id)
    ;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(__return_storage_ptr__,__x);
  }
  else {
    pvVar2 = std::
             vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)level);
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](pvVar2,(long)to_agg_id);
    local_58._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar3);
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)level);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](pvVar2,(long)to_agg_id);
      temp_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::vector<int,_std::allocator<int>_>::end(pvVar3);
      bVar1 = __gnu_cxx::operator!=
                        (&local_58,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &temp_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar1) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)local_90,this,level + -1
                          ,*piVar4);
      __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90);
      __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                ((set<int,std::less<int>,std::allocator<int>> *)__return_storage_ptr__,
                 (_Rb_tree_const_iterator<int>)__first._M_node,
                 (_Rb_tree_const_iterator<int>)__last._M_node);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58,0);
    }
    this_00 = std::
              vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::operator[](&this->node_to_coverage_ids_,(long)level);
    this_01 = std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::operator[](this_00,(long)to_agg_id);
    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(this_01,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<int> fmcalc::assign_coverage_ids(const int level, const int to_agg_id)
{
	std::set<int> ret_set;
	if (level == 0) {   // Youngest generation
		ret_set.insert(item_to_cov_id_[to_agg_id]);
		return ret_set;
	}

	for (std::vector<int>::iterator agg_id = node_to_direct_sub_nodes_vec_[level][to_agg_id].begin();
			agg_id != node_to_direct_sub_nodes_vec_[level][to_agg_id].end(); agg_id++) {

		std::set<int> temp_set = assign_coverage_ids(level-1, *agg_id);
		ret_set.insert(temp_set.begin(), temp_set.end());

	}

	node_to_coverage_ids_[level][to_agg_id] = ret_set;
	return ret_set;
}